

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

char * funcnamefromcode(lua_State *L,CallInfo *ci,char **name)

{
  uint uVar1;
  Proto *p_00;
  int lastpc;
  char *pcVar2;
  int offset;
  Instruction i;
  int pc;
  Proto *p;
  TMS tm;
  char **name_local;
  CallInfo *ci_local;
  lua_State *L_local;
  
  p_00 = *(Proto **)((ci->func->value_).f + 0x18);
  lastpc = currentpc(ci);
  uVar1 = p_00->code[lastpc];
  if ((ci->callstatus & 4) == 0) {
    switch(uVar1 & 0x3f) {
    case 6:
    case 7:
    case 0xc:
      p._4_4_ = 0;
      break;
    case 8:
    case 10:
      p._4_4_ = 1;
      break;
    default:
      return (char *)0x0;
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
      p._4_4_ = (uVar1 & 0x3f) - 7;
      break;
    case 0x19:
      p._4_4_ = 0x12;
      break;
    case 0x1a:
      p._4_4_ = 0x13;
      break;
    case 0x1c:
      p._4_4_ = 4;
      break;
    case 0x1d:
      p._4_4_ = 0x16;
      break;
    case 0x1f:
      p._4_4_ = 5;
      break;
    case 0x20:
      p._4_4_ = 0x14;
      break;
    case 0x21:
      p._4_4_ = 0x15;
      break;
    case 0x24:
    case 0x25:
      pcVar2 = getobjname(p_00,lastpc,uVar1 >> 6 & 0xff,name);
      return pcVar2;
    case 0x29:
      *name = "for iterator";
      L_local = (lua_State *)anon_var_dwarf_46a6;
      return (char *)L_local;
    }
    *name = (char *)(L->l_G->tmname[p._4_4_] + 1);
    L_local = (lua_State *)anon_var_dwarf_467a;
    return (char *)L_local;
  }
  *name = "?";
  L_local = (lua_State *)0x192163;
  return (char *)L_local;
}

Assistant:

static const char *funcnamefromcode (lua_State *L, CallInfo *ci,
                                     const char **name) {
  TMS tm = (TMS)0;  /* (initial value avoids warnings) */
  Proto *p = ci_func(ci)->p;  /* calling function */
  int pc = currentpc(ci);  /* calling instruction index */
  Instruction i = p->code[pc];  /* calling instruction */
  if (ci->callstatus & CIST_HOOKED) {  /* was it called inside a hook? */
    *name = "?";
    return "hook";
  }
  switch (GET_OPCODE(i)) {
    case OP_CALL:
    case OP_TAILCALL:
      return getobjname(p, pc, GETARG_A(i), name);  /* get function name */
    case OP_TFORCALL: {  /* for iterator */
      *name = "for iterator";
       return "for iterator";
    }
    /* other instructions can do calls through metamethods */
    case OP_SELF: case OP_GETTABUP: case OP_GETTABLE:
      tm = TM_INDEX;
      break;
    case OP_SETTABUP: case OP_SETTABLE:
      tm = TM_NEWINDEX;
      break;
    case OP_ADD: case OP_SUB: case OP_MUL: case OP_MOD:
    case OP_POW: case OP_DIV: case OP_IDIV: case OP_BAND:
    case OP_BOR: case OP_BXOR: case OP_SHL: case OP_SHR: {
      int offset = cast_int(GET_OPCODE(i)) - cast_int(OP_ADD);  /* ORDER OP */
      tm = cast(TMS, offset + cast_int(TM_ADD));  /* ORDER TM */
      break;
    }
    case OP_UNM: tm = TM_UNM; break;
    case OP_BNOT: tm = TM_BNOT; break;
    case OP_LEN: tm = TM_LEN; break;
    case OP_CONCAT: tm = TM_CONCAT; break;
    case OP_EQ: tm = TM_EQ; break;
    case OP_LT: tm = TM_LT; break;
    case OP_LE: tm = TM_LE; break;
    default:
      return NULL;  /* cannot find a reasonable name */
  }
  *name = getstr(G(L)->tmname[tm]);
  return "metamethod";
}